

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void check_waterbreath(CHAR_DATA *ch,ROOM_INDEX_DATA *to_room)

{
  bool bVar1;
  ROOM_INDEX_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 uVar2;
  undefined2 in_stack_ffffffffffffffa4;
  short sVar3;
  undefined2 in_stack_ffffffffffffffa6;
  undefined2 uVar4;
  undefined6 in_stack_ffffffffffffffaa;
  CHAR_DATA *in_stack_ffffffffffffffb0;
  
  bVar1 = is_affected(in_RDI,(int)gsn_drowning);
  if ((((bVar1) || (in_RSI->sector_type != 8)) ||
      (bVar1 = is_affected_room(in_RSI,(int)gsn_airy_water), bVar1)) ||
     ((bVar1 = is_immortal(in_stack_ffffffffffffff88), bVar1 ||
      (bVar1 = is_heroimm(in_stack_ffffffffffffff88), bVar1)))) {
    bVar1 = is_affected(in_RDI,(int)gsn_drowning);
    if ((bVar1) &&
       ((in_RSI->sector_type != 8 || (bVar1 = is_affected_room(in_RSI,(int)gsn_airy_water), bVar1)))
       ) {
      affect_strip((CHAR_DATA *)
                   CONCAT26(in_stack_ffffffffffffffa6,
                            CONCAT24(in_stack_ffffffffffffffa4,
                                     CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)))
                   ,in_stack_ffffffffffffff9c);
    }
  }
  else {
    init_affect((AFFECT_DATA *)0x55d1b7);
    uVar2 = 0;
    uVar4 = 0x3c;
    sVar3 = gsn_drowning;
    new_affect_to_char(in_stack_ffffffffffffffb0,
                       (AFFECT_DATA *)CONCAT62(in_stack_ffffffffffffffaa,5));
    act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffffa0))),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
    act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffffa0))),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  }
  return;
}

Assistant:

void check_waterbreath(CHAR_DATA *ch, ROOM_INDEX_DATA *to_room)
{
	if (!is_affected(ch, gsn_drowning)
		&& to_room->sector_type == SECT_UNDERWATER
		&& !is_affected_room(to_room, gsn_airy_water)
		&& !is_immortal(ch)
		&& !is_heroimm(ch))
	{
		AFFECT_DATA af;
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_drowning;
		af.level = 60;
		af.duration = 5;
		af.tick_fun = drowning_tick;

		new_affect_to_char(ch, &af);

		act("You take a deep breath and hold it tight as you descend into the water.", ch, 0, 0, TO_CHAR);
		act("$n takes a deep breath as $e descends into the water.", ch, 0, 0, TO_ROOM);
	}
	else if (is_affected(ch, gsn_drowning)
		&& (to_room->sector_type != SECT_UNDERWATER || is_affected_room(to_room, gsn_airy_water)))
	{
		affect_strip(ch, gsn_drowning);
	}
}